

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall QTableCornerButton::QTableCornerButton(QTableCornerButton *this,QWidget *parent)

{
  undefined8 *in_RDI;
  
  QAbstractButton::QAbstractButton(&this->super_QAbstractButton,parent);
  *in_RDI = &PTR_metaObject_00d300d0;
  in_RDI[2] = &PTR__QTableCornerButton_00d30298;
  return;
}

Assistant:

void paintEvent(QPaintEvent*) override {
        QStyleOptionHeader opt;
        opt.initFrom(this);
        QStyle::State state = QStyle::State_None;
        if (isEnabled())
            state |= QStyle::State_Enabled;
        if (isActiveWindow())
            state |= QStyle::State_Active;
        if (isDown())
            state |= QStyle::State_Sunken;
        opt.state = state;
        opt.rect = rect();
        opt.position = QStyleOptionHeader::OnlyOneSection;
        QPainter painter(this);
        style()->drawControl(QStyle::CE_Header, &opt, &painter, this);
    }